

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

int __thiscall
notch::core::SharedBuffers::clone
          (SharedBuffers *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool bVar1;
  valarray<float> local_50 [2];
  valarray<float> local_30;
  undefined1 local_19;
  __fn *local_18;
  SharedBuffers *this_local;
  SharedBuffers *newBuffers;
  
  local_19 = 0;
  local_18 = __fn;
  this_local = this;
  SharedBuffers(this);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)__fn);
  if (bVar1) {
    std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
              )__fn);
    ::std::make_shared<std::valarray<float>,std::valarray<float>&>(&local_30);
    std::shared_ptr<std::valarray<float>_>::operator=
              (&this->inputBuffer,(shared_ptr<std::valarray<float>_> *)&local_30);
    std::shared_ptr<std::valarray<float>_>::~shared_ptr
              ((shared_ptr<std::valarray<float>_> *)&local_30);
  }
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(__fn + 0x10));
  if (bVar1) {
    std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
              )(__fn + 0x10));
    ::std::make_shared<std::valarray<float>,std::valarray<float>&>(local_50);
    std::shared_ptr<std::valarray<float>_>::operator=
              (&this->outputBuffer,(shared_ptr<std::valarray<float>_> *)local_50);
    std::shared_ptr<std::valarray<float>_>::~shared_ptr
              ((shared_ptr<std::valarray<float>_> *)local_50);
  }
  return (int)this;
}

Assistant:

SharedBuffers clone() const {
        SharedBuffers newBuffers;
        if (inputBuffer) {
            newBuffers.inputBuffer = std::make_shared<Array>(*inputBuffer);
        }
        if (outputBuffer) {
            newBuffers.outputBuffer = std::make_shared<Array>(*outputBuffer);
        }
        return newBuffers;
    }